

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O1

void __thiscall
Rml::ElementText::GenerateDecoration(ElementText *this,Mesh *mesh,FontFaceHandle font_face_handle)

{
  pointer pLVar1;
  code *pcVar2;
  Vector2f position;
  Vector2f size;
  bool bVar3;
  int iVar4;
  FontEngineInterface *pFVar5;
  undefined4 extraout_var;
  Line *line;
  pointer pLVar7;
  float fVar8;
  long lVar6;
  
  if (((this->decoration)._M_t.
       super___uniq_ptr_impl<Rml::Geometry,_std::default_delete<Rml::Geometry>_>._M_t.
       super__Tuple_impl<0UL,_Rml::Geometry_*,_std::default_delete<Rml::Geometry>_>.
       super__Head_base<0UL,_Rml::Geometry_*,_false>._M_head_impl == (Geometry *)0x0) &&
     (bVar3 = Assert("RMLUI_ASSERT(decoration)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementText.cpp"
                     ,0x1e5), !bVar3)) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  pFVar5 = GetFontEngineInterface();
  iVar4 = (*pFVar5->_vptr_FontEngineInterface[8])(pFVar5,font_face_handle);
  lVar6 = CONCAT44(extraout_var,iVar4);
  switch(this->decoration_property) {
  case None:
    goto switchD_00232d94_caseD_0;
  case Underline:
    fVar8 = *(float *)(lVar6 + 0x14);
    break;
  case Overline:
    fVar8 = *(float *)(lVar6 + 4) * -1.1;
    break;
  case LineThrough:
    fVar8 = *(float *)(lVar6 + 0x10) * -0.65;
    break;
  default:
    fVar8 = 0.0;
  }
  pLVar1 = (this->lines).
           super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pLVar7 = (this->lines).
                super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>.
                _M_impl.super__Vector_impl_data._M_start; pLVar7 != pLVar1; pLVar7 = pLVar7 + 1) {
    position.y = (pLVar7->position).y + fVar8;
    position.x = (pLVar7->position).x;
    size.y = *(float *)(lVar6 + 0x18);
    size.x = (float)pLVar7->width;
    MeshUtilities::GenerateLine(mesh,position,size,this->colour);
  }
switchD_00232d94_caseD_0:
  return;
}

Assistant:

void ElementText::GenerateDecoration(Mesh& mesh, const FontFaceHandle font_face_handle)
{
	RMLUI_ZoneScopedC(0xA52A2A);
	RMLUI_ASSERT(decoration);

	const FontMetrics& metrics = GetFontEngineInterface()->GetFontMetrics(font_face_handle);

	float offset = 0.f;
	switch (decoration_property)
	{
	case Style::TextDecoration::Underline: offset = metrics.underline_position; break;
	case Style::TextDecoration::Overline: offset = -1.1f * metrics.ascent; break;
	case Style::TextDecoration::LineThrough: offset = -0.65f * metrics.x_height; break;
	case Style::TextDecoration::None: return;
	}

	for (const Line& line : lines)
	{
		const Vector2f position = {line.position.x, line.position.y + offset};
		const Vector2f size = {(float)line.width, metrics.underline_thickness};
		MeshUtilities::GenerateLine(mesh, position, size, colour);
	}
}